

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax
          (FunctionDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          FunctionPrototypeSyntax *prototype,Token semi,SyntaxList<slang::syntax::SyntaxNode> *items
          ,Token end,NamedBlockClauseSyntax *endBlockName)

{
  bool bVar1;
  FunctionPrototypeSyntax *pFVar2;
  reference ppSVar3;
  MemberSyntax *in_RCX;
  SyntaxList<slang::syntax::SyntaxNode> *in_RDI;
  size_t in_R8;
  pointer in_R9;
  SyntaxNode *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  SyntaxList<slang::syntax::SyntaxNode> *this_00;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
  local_48;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffc0;
  FunctionPrototypeSyntax *in_stack_ffffffffffffffc8;
  
  this_00 = (SyntaxList<slang::syntax::SyntaxNode> *)&child;
  MemberSyntax::MemberSyntax
            (in_RCX,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),in_stack_ffffffffffffffc0
            );
  not_null<slang::syntax::FunctionPrototypeSyntax_*>::
  not_null<slang::syntax::FunctionPrototypeSyntax_*>
            ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)
             &in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode,
             (FunctionPrototypeSyntax **)&stack0xffffffffffffffc8);
  in_RDI[1].super_SyntaxListBase.childCount = in_R8;
  in_RDI[1].super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr = in_R9;
  SyntaxList<slang::syntax::SyntaxNode>::SyntaxList(in_RDI,this_00);
  in_RDI[2].super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = (size_t)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[3].super_SyntaxListBase._vptr_SyntaxListBase =
       *(_func_int ***)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  *(SyntaxNode ***)&in_RDI[3].super_SyntaxListBase.super_SyntaxNode = __begin2._M_current;
  pFVar2 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                     ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x29bac7);
  (pFVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
  *(SyntaxList<slang::syntax::SyntaxNode> **)&in_RDI[2].super_SyntaxListBase.super_SyntaxNode =
       in_RDI;
  local_48._M_current =
       (SyntaxNode **)
       std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> *)this_00);
  std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
              ::operator*(&local_48);
    (*ppSVar3)->parent = (SyntaxNode *)in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::SyntaxNode_**,_std::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  if (*(SyntaxNode **)&in_RDI[3].super_SyntaxListBase.super_SyntaxNode != (SyntaxNode *)0x0) {
    (*(SyntaxNode **)&in_RDI[3].super_SyntaxListBase.super_SyntaxNode)->parent =
         (SyntaxNode *)in_RDI;
  }
  return;
}

Assistant:

FunctionDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, FunctionPrototypeSyntax& prototype, Token semi, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(kind, attributes), prototype(&prototype), semi(semi), items(items), end(end), endBlockName(endBlockName) {
        this->prototype->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }